

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree_test.cpp
# Opt level: O1

pint tree_complexity(PTree *tree)

{
  int iVar1;
  int iVar2;
  double dVar3;
  
  iVar1 = p_tree_get_nnodes();
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    iVar2 = p_tree_get_type(tree);
    iVar1 = p_tree_get_nnodes(tree);
    if (iVar2 == 2) {
      dVar3 = log((double)(iVar1 + 2) * 2.23606797749979);
      iVar1 = (int)(dVar3 / 0.48121182505960347 + -2.0);
    }
    else if (iVar2 == 1) {
      dVar3 = log((double)iVar1 + 1.0);
      iVar1 = (int)(dVar3 / 0.6931471805599453) * 2;
    }
  }
  return iVar1;
}

Assistant:

static pint
tree_complexity (const PTree *tree)
{
	if (tree == NULL || p_tree_get_nnodes (tree) == 0)
		return 0;

	switch (p_tree_get_type (tree)) {
	case P_TREE_TYPE_BINARY:
		return p_tree_get_nnodes (tree);
	case P_TREE_TYPE_RB:
		return 2 * ((pint) (log ((double) p_tree_get_nnodes (tree) + 1) / log (2.0)));
	case P_TREE_TYPE_AVL:
	{
		double phi = (1 + sqrt (5.0)) / 2.0;
		return (pint) (log (sqrt (5.0) * (p_tree_get_nnodes (tree) + 2)) / log (phi) - 2);
	}
	default:
		return p_tree_get_nnodes (tree);
	}
}